

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::Response<capnp::AnyPointer>_> * __thiscall
kj::_::NullableValue<capnp::Response<capnp::AnyPointer>_>::operator=
          (NullableValue<capnp::Response<capnp::AnyPointer>_> *this,
          NullableValue<capnp::Response<capnp::AnyPointer>_> *other)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  ResponseHook *pRVar3;
  int iVar4;
  undefined4 uVar5;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&(this->field_1).value.hook);
    }
    if (other->isSet == true) {
      pSVar1 = (other->field_1).value.super_Reader.reader.segment;
      pCVar2 = (other->field_1).value.super_Reader.reader.capTable;
      iVar4 = *(int *)((long)&other->field_1 + 0x18);
      uVar5 = *(undefined4 *)((long)&other->field_1 + 0x1c);
      (this->field_1).value.super_Reader.reader.pointer =
           (other->field_1).value.super_Reader.reader.pointer;
      *(int *)((long)&this->field_1 + 0x18) = iVar4;
      *(undefined4 *)((long)&this->field_1 + 0x1c) = uVar5;
      (this->field_1).value.super_Reader.reader.segment = pSVar1;
      (this->field_1).value.super_Reader.reader.capTable = pCVar2;
      pRVar3 = (other->field_1).value.hook.ptr;
      (this->field_1).value.hook.disposer = (other->field_1).value.hook.disposer;
      (this->field_1).value.hook.ptr = pRVar3;
      (other->field_1).value.hook.ptr = (ResponseHook *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }